

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckArrayCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArrayCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int line;
  TestDetails testDetails;
  float local_8ac;
  ScopedCurrentTest scopedResults;
  int data2 [4];
  int data1 [4];
  TestDetails local_870;
  TestResults testResults;
  RecordingReporter reporter;
  
  line = 0;
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&testResults,&reporter.super_TestReporter);
  UnitTest::TestDetails::TestDetails(&testDetails,"arrayCloseTest","arrayCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&testResults,&testDetails);
  data1[0] = 0;
  data1[1] = 1;
  data1[2] = 2;
  data1[3] = 3;
  data2[0] = 0;
  data2[1] = 1;
  data2[2] = 3;
  data2[3] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8ac = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,400);
  UnitTest::CheckArrayClose<int[4],int[4],float>(pTVar1,&data1,&data2,4,&local_8ac,&local_870);
  line = 400;
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x193);
  UnitTest::CheckEqual(pTVar1,"arrayCloseTest",reporter.lastFailedTest,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x194);
  UnitTest::CheckEqual(pTVar1,"arrayCloseSuite",reporter.lastFailedSuite,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x195);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastFailedFile,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x196);
  UnitTest::CheckEqual<int,int>(pTVar1,&line,&reporter.lastFailedLine,&testDetails);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(CheckArrayCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("arrayCloseTest", "arrayCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("arrayCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("arrayCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}